

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Request::SetRequestType(Request *this)

{
  char *pcVar1;
  headers_t pcVar2;
  runtime_error *this_00;
  undefined8 uVar3;
  EasyHandle EVar4;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(this->request_type_) {
  case GET:
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar1 = (char *)0x1;
    uVar3 = 0x50;
    break;
  case PUT:
    pcVar2 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar2;
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar1 = (char *)0x1;
    uVar3 = 0x2e;
    break;
  case POST:
    pcVar2 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar2;
    curl_easy_setopt(((this->eh_)._M_t.
                      super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                      .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_
                     ,0x2e,0);
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar1 = (char *)0x1;
    uVar3 = 0x2f;
    break;
  case HEAD:
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar1 = (char *)0x1;
    uVar3 = 0x2c;
    break;
  case DELETE:
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar1 = "DELETE";
    goto LAB_00105c4d;
  case PATCH:
    pcVar2 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar2;
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar1 = "PATCH";
    goto LAB_00105c4d;
  case OPTIONS:
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar1 = "OPTIONS";
LAB_00105c4d:
    uVar3 = 0x2734;
    break;
  case POST_MIME:
    pcVar1 = (char *)this->mime_;
    if ((curl_mime *)pcVar1 == (curl_mime *)0x0) {
      pcVar1 = (char *)curl_mime_init(((this->eh_)._M_t.
                                       super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                                       .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>.
                                      _M_head_impl)->handle_);
      this->mime_ = (curl_mime *)pcVar1;
    }
    EVar4.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    uVar3 = 0x281d;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_58,this->request_type_);
    std::operator+(&local_38,"Unsupported request type",&sStack_58);
    std::runtime_error::runtime_error(this_00,(string *)&local_38);
    *(undefined ***)this_00 = &PTR__runtime_error_00109d48;
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  curl_easy_setopt(EVar4.handle_,uVar3,pcVar1);
  return;
}

Assistant:

void SetRequestType() {
            switch(request_type_) {
                case RequestType::GET:
                    curl_easy_setopt(*eh_, CURLOPT_HTTPGET, 1L);
                    break;
                case RequestType::PUT:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 1L);
                    break;
                case RequestType::POST:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 0L);
                    curl_easy_setopt(*eh_, CURLOPT_POST, 1L);
                    break;
                case RequestType::HEAD:
                    curl_easy_setopt(*eh_, CURLOPT_NOBODY, 1L);
                    break;
                case RequestType::OPTIONS:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "OPTIONS");
                    break;
                case RequestType::PATCH:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "PATCH");
                    break;
                case RequestType::DELETE:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "DELETE");
                    break;
                case RequestType::POST_MIME:
                    InitMime();
                    curl_easy_setopt(*eh_, CURLOPT_MIMEPOST, mime_);
                    break;
                default:
                    throw Exception("Unsupported request type" + std::to_string(static_cast<int>(request_type_)));
            }
        }